

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Importer::ImportNodes(glTF2Importer *this,Asset *r)

{
  uint uVar1;
  aiScene *paVar2;
  pointer pRVar3;
  bool bVar4;
  Scene *pSVar5;
  size_type sVar6;
  reference pvVar7;
  aiNode *paVar8;
  aiNode **ppaVar9;
  aiNode *node;
  uint i;
  aiNode *local_50;
  aiNode *root;
  uint local_34;
  undefined1 local_30 [4];
  uint numRootNodes;
  vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> rootNodes;
  Asset *r_local;
  glTF2Importer *this_local;
  
  rootNodes.super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)r;
  bVar4 = glTF2::Ref::operator_cast_to_bool((Ref *)&r->scene);
  if (bVar4) {
    pSVar5 = glTF2::Ref<glTF2::Scene>::operator->
                       ((Ref<glTF2::Scene> *)
                        (rootNodes.
                         super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 0xa0));
    std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::vector
              ((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> *)
               local_30,&pSVar5->nodes);
    sVar6 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::size
                      ((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> *
                       )local_30);
    pRVar3 = rootNodes.
             super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_34 = (uint)sVar6;
    if (local_34 == 1) {
      paVar2 = this->mScene;
      pvVar7 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
               operator[]((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                           *)local_30,0);
      paVar8 = ImportNode(paVar2,(Asset *)pRVar3,&this->meshOffsets,pvVar7);
      this->mScene->mRootNode = paVar8;
    }
    else if (1 < local_34) {
      paVar8 = (aiNode *)operator_new(0x478);
      node._6_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"ROOT",(allocator<char> *)((long)&node + 7));
      aiNode::aiNode(paVar8,(string *)&i);
      node._6_1_ = 0;
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)((long)&node + 7));
      local_50 = paVar8;
      ppaVar9 = (aiNode **)operator_new__((ulong)local_34 << 3);
      local_50->mChildren = ppaVar9;
      for (node._0_4_ = 0;
          pRVar3 = rootNodes.
                   super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage, (uint)node < local_34;
          node._0_4_ = (uint)node + 1) {
        paVar2 = this->mScene;
        pvVar7 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
                 operator[]((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                             *)local_30,(ulong)(uint)node);
        paVar8 = ImportNode(paVar2,(Asset *)pRVar3,&this->meshOffsets,pvVar7);
        paVar8->mParent = local_50;
        uVar1 = local_50->mNumChildren;
        local_50->mNumChildren = uVar1 + 1;
        local_50->mChildren[uVar1] = paVar8;
      }
      this->mScene->mRootNode = local_50;
    }
    std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::~vector
              ((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> *)
               local_30);
  }
  return;
}

Assistant:

void glTF2Importer::ImportNodes(glTF2::Asset &r) {
	if (!r.scene) {
        return;
    }

	std::vector<Ref<Node>> rootNodes = r.scene->nodes;

	// The root nodes
	unsigned int numRootNodes = unsigned(rootNodes.size());
	if (numRootNodes == 1) { // a single root node: use it
		mScene->mRootNode = ImportNode(mScene, r, meshOffsets, rootNodes[0]);
	} else if (numRootNodes > 1) { // more than one root node: create a fake root
		aiNode *root = new aiNode("ROOT");
		root->mChildren = new aiNode *[numRootNodes];
		for (unsigned int i = 0; i < numRootNodes; ++i) {
			aiNode *node = ImportNode(mScene, r, meshOffsets, rootNodes[i]);
			node->mParent = root;
			root->mChildren[root->mNumChildren++] = node;
		}
		mScene->mRootNode = root;
	}
}